

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_sbo_cow.hpp
# Opt level: O0

void __thiscall
printable_sbo_cow::printable_sbo_cow<large_printable>
          (printable_sbo_cow *this,large_printable *value)

{
  handle_base *phVar1;
  large_printable local_2030;
  large_printable *local_18;
  large_printable *value_local;
  printable_sbo_cow *this_local;
  
  this->handle_ = (handle_base *)0x0;
  (this->buffer_)._M_elems[0] = '\0';
  (this->buffer_)._M_elems[1] = '\0';
  (this->buffer_)._M_elems[2] = '\0';
  (this->buffer_)._M_elems[3] = '\0';
  (this->buffer_)._M_elems[4] = '\0';
  (this->buffer_)._M_elems[5] = '\0';
  (this->buffer_)._M_elems[6] = '\0';
  (this->buffer_)._M_elems[7] = '\0';
  (this->buffer_)._M_elems[8] = '\0';
  (this->buffer_)._M_elems[9] = '\0';
  (this->buffer_)._M_elems[10] = '\0';
  (this->buffer_)._M_elems[0xb] = '\0';
  (this->buffer_)._M_elems[0xc] = '\0';
  (this->buffer_)._M_elems[0xd] = '\0';
  (this->buffer_)._M_elems[0xe] = '\0';
  (this->buffer_)._M_elems[0xf] = '\0';
  (this->buffer_)._M_elems[0x10] = '\0';
  (this->buffer_)._M_elems[0x11] = '\0';
  (this->buffer_)._M_elems[0x12] = '\0';
  (this->buffer_)._M_elems[0x13] = '\0';
  (this->buffer_)._M_elems[0x14] = '\0';
  (this->buffer_)._M_elems[0x15] = '\0';
  (this->buffer_)._M_elems[0x16] = '\0';
  (this->buffer_)._M_elems[0x17] = '\0';
  local_18 = value;
  value_local = (large_printable *)this;
  large_printable::large_printable(&local_2030,value);
  phVar1 = clone_impl<large_printable>(&local_2030,&this->buffer_);
  this->handle_ = phVar1;
  large_printable::~large_printable(&local_2030);
  return;
}

Assistant:

printable_sbo_cow (T value) :
        handle_ (nullptr),
        buffer_ {}
    { handle_ = clone_impl(std::move(value), buffer_); }